

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O0

int __thiscall crnlib::dxt_image::init(dxt_image *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  uint uVar2;
  ulong extraout_RAX;
  long in_RCX;
  image<crnlib::color_quad<unsigned_char,_int>_> *in_RDX;
  uint uVar4;
  uint i;
  init_task_params init_params;
  task_pool tmp_pool;
  task_pool *pPool;
  task_pool *in_stack_fffffffffffffca0;
  code *in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcd0;
  uint uVar5;
  undefined4 in_stack_fffffffffffffcdc;
  task_pool local_2f0;
  task_pool *local_30;
  long local_28;
  image<crnlib::color_quad<unsigned_char,_int>_> *local_20;
  uint local_14;
  dxt_image *local_10;
  undefined1 local_1;
  ulong uVar3;
  
  uVar4 = (uint)ctx;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_14 = uVar4;
  local_10 = this;
  uVar1 = image<crnlib::color_quad<unsigned_char,_int>_>::get_width(in_RDX);
  image<crnlib::color_quad<unsigned_char,_int>_>::get_height(local_20);
  uVar2 = init(this,(EVP_PKEY_CTX *)(ulong)uVar4);
  uVar3 = (ulong)uVar2;
  if ((uVar2 & 1) == 0) {
    local_1 = 0;
    goto LAB_0021833f;
  }
  local_30 = *(task_pool **)(local_28 + 0x30);
  task_pool::task_pool((task_pool *)in_stack_fffffffffffffcc0);
  if (local_30 == (task_pool *)0x0) {
    uVar2 = task_pool::init(&local_2f0,(EVP_PKEY_CTX *)(ulong)*(uint *)(local_28 + 4));
    if ((uVar2 & 1) != 0) {
      local_30 = &local_2f0;
      goto LAB_00218251;
    }
    local_1 = 0;
  }
  else {
LAB_00218251:
    uVar2 = local_14;
    in_stack_fffffffffffffca0 = (task_pool *)crn_get_current_thread_id();
    for (uVar5 = 0; uVar5 <= *(uint *)(local_28 + 4); uVar5 = uVar5 + 1) {
      in_stack_fffffffffffffcc0 = init_task;
      task_pool::
      queue_object_task<crnlib::dxt_image,void(crnlib::dxt_image::*)(unsigned_long_long,void*)>
                ((task_pool *)CONCAT44(in_stack_fffffffffffffcdc,uVar2),
                 (dxt_image *)CONCAT44(uVar5,in_stack_fffffffffffffcd0),0x216f20,
                 CONCAT44(uVar1,uVar4),this);
    }
    task_pool::join((task_pool *)in_stack_fffffffffffffcc0);
    local_1 = 1;
  }
  task_pool::~task_pool(in_stack_fffffffffffffca0);
  uVar3 = extraout_RAX;
LAB_0021833f:
  return (uint)CONCAT71((int7)(uVar3 >> 8),local_1) & 0xffffff01;
}

Assistant:

bool dxt_image::init(dxt_format fmt, const image_u8& img, const pack_params& p) {
  if (!init(fmt, img.get_width(), img.get_height(), false))
    return false;

#if CRNLIB_SUPPORT_ATI_COMPRESS
  if (p.m_compressor == cCRNDXTCompressorATI)
    return init_ati_compress(fmt, img, p);
#endif

  task_pool* pPool = p.m_pTask_pool;

  task_pool tmp_pool;
  if (!pPool) {
    if (!tmp_pool.init(p.m_num_helper_threads))
      return false;
    pPool = &tmp_pool;
  }

  init_task_params init_params;
  init_params.m_fmt = fmt;
  init_params.m_pImg = &img;
  init_params.m_pParams = &p;
  init_params.m_main_thread = crn_get_current_thread_id();
  init_params.m_canceled = false;

  for (uint i = 0; i <= p.m_num_helper_threads; i++)
    pPool->queue_object_task(this, &dxt_image::init_task, i, &init_params);

  pPool->join();

  if (init_params.m_canceled)
    return false;

  return true;
}